

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::postsolve(Highs *this,HighsSolution *solution)

{
  HighsStatus HVar1;
  HighsBasis *in_RDI;
  HighsBasis basis;
  HighsBasis *in_stack_ffffffffffffff90;
  HighsBasis *in_stack_ffffffffffffffb8;
  HighsSolution *in_stack_ffffffffffffffc0;
  Highs *in_stack_ffffffffffffffc8;
  
  HighsBasis::HighsBasis(in_stack_ffffffffffffff90);
  HVar1 = postsolve(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  HighsBasis::~HighsBasis(in_RDI);
  return HVar1;
}

Assistant:

HighsStatus Highs::postsolve(const HighsSolution& solution) {
  HighsBasis basis;
  return this->postsolve(solution, basis);
}